

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktOpaqueTypeIndexingTests.cpp
# Opt level: O0

void vkt::shaderexecutor::anon_unknown_0::declareUniformIndexVars
               (ostream *str,deUint32 bindingLocation,char *varPrefix,int numVars)

{
  ostream *poVar1;
  int local_28;
  int varNdx;
  int numVars_local;
  char *varPrefix_local;
  deUint32 bindingLocation_local;
  ostream *str_local;
  
  poVar1 = std::operator<<(str,"layout(set = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  poVar1 = std::operator<<(poVar1,", binding = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,bindingLocation);
  std::operator<<(poVar1,", std140) uniform Indices\n{\n");
  for (local_28 = 0; local_28 < numVars; local_28 = local_28 + 1) {
    poVar1 = std::operator<<(str,"\thighp int ");
    poVar1 = std::operator<<(poVar1,varPrefix);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28);
    std::operator<<(poVar1,";\n");
  }
  std::operator<<(str,"};\n");
  return;
}

Assistant:

static void declareUniformIndexVars (std::ostream& str, deUint32 bindingLocation, const char* varPrefix, int numVars)
{
	str << "layout(set = " << EXTRA_RESOURCES_DESCRIPTOR_SET_INDEX << ", binding = " << bindingLocation << ", std140) uniform Indices\n{\n";

	for (int varNdx = 0; varNdx < numVars; varNdx++)
		str << "\thighp int " << varPrefix << varNdx << ";\n";

	str << "};\n";
}